

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

void pack_grammar(void)

{
  char **__ptr;
  arg_cache *paVar1;
  arg_cache *__ptr_00;
  Yshort *pYVar2;
  Yshort *pYVar3;
  bucket **ppbVar4;
  bucket **ppbVar5;
  long lVar6;
  char cVar7;
  Yshort YVar8;
  ulong uVar9;
  bucket *pbVar10;
  int i;
  int iVar11;
  
  ritem = (Yshort *)allocate(nitems << 2);
  if (ritem == (Yshort *)0x0) {
    no_space();
  }
  rlhs = (Yshort *)allocate(nrules << 2);
  if (rlhs == (Yshort *)0x0) {
    no_space();
  }
  rrhs = (Yshort *)allocate(nrules * 4 + 4);
  if (rrhs == (Yshort *)0x0) {
    no_space();
  }
  rprec = (Yshort *)realloc(rprec,(ulong)(uint)(nrules << 2));
  if (rprec == (Yshort *)0x0) {
    no_space();
  }
  rassoc = (char *)realloc(rassoc,(ulong)(uint)nrules);
  if (rassoc == (char *)0x0) {
    no_space();
  }
  pYVar2 = ritem;
  *ritem = -1;
  pYVar2[1] = goal->index;
  pYVar2[2] = 0;
  pYVar3 = rlhs;
  pYVar2[3] = -2;
  pYVar2 = rlhs;
  pYVar2[0] = 0;
  pYVar2[1] = 0;
  pYVar3[2] = start_symbol;
  pYVar2 = rrhs;
  pYVar2[0] = 0;
  pYVar2[1] = 0;
  pYVar2[2] = 1;
  ppbVar5 = plhs;
  ppbVar4 = pitem;
  if (nrules < 4) {
    iVar11 = 4;
    uVar9 = 3;
  }
  else {
    iVar11 = 4;
    uVar9 = 3;
    do {
      if (0 < ppbVar5[uVar9]->args) {
        __ptr = ppbVar5[uVar9]->argnames;
        if (__ptr != (char **)0x0) {
          free(__ptr);
          ppbVar5[uVar9]->argnames = (char **)0x0;
        }
        if (ppbVar5[uVar9]->argtags != (char **)0x0) {
          free(ppbVar5[uVar9]->argtags);
          ppbVar5[uVar9]->argtags = (char **)0x0;
        }
      }
      rlhs[uVar9] = ppbVar5[uVar9]->index;
      rrhs[uVar9] = iVar11;
      pYVar2 = ritem;
      lVar6 = (long)iVar11;
      pbVar10 = ppbVar4[lVar6];
      if (pbVar10 == (bucket *)0x0) {
        cVar7 = '\0';
        YVar8 = 0;
      }
      else {
        YVar8 = 0;
        cVar7 = '\0';
        do {
          pYVar2[lVar6] = pbVar10->index;
          if (pbVar10->class == '\x01') {
            YVar8 = pbVar10->prec;
            cVar7 = pbVar10->assoc;
          }
          pbVar10 = ppbVar4[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (pbVar10 != (bucket *)0x0);
        iVar11 = (int)lVar6;
      }
      ritem[lVar6] = -(int)uVar9;
      if (rprec[uVar9] == -1) {
        rprec[uVar9] = YVar8;
        rassoc[uVar9] = cVar7;
      }
      iVar11 = iVar11 + 1;
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)nrules);
    uVar9 = uVar9 & 0xffffffff;
  }
  rrhs[uVar9] = iVar11;
  free(plhs);
  free(pitem);
  lVar6 = 0;
  do {
    __ptr_00 = arg_cache[lVar6];
    while (__ptr_00 != (arg_cache *)0x0) {
      free(__ptr_00->code);
      paVar1 = __ptr_00->next;
      free(__ptr_00);
      __ptr_00 = paVar1;
    }
    arg_cache[lVar6] = (arg_cache *)0x0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x400);
  return;
}

Assistant:

void pack_grammar()
{
    register int i, j;
    int assoc, prec;

    ritem = NEW2(nitems, Yshort);
    if (ritem == 0) no_space();
    rlhs = NEW2(nrules, Yshort);
    if (rlhs == 0) no_space();
    rrhs = NEW2(nrules+1, Yshort);
    if (rrhs == 0) no_space();
    rprec = RENEW(rprec, nrules, Yshort);
    if (rprec == 0) no_space();
    rassoc = RENEW(rassoc, nrules, char);
    if (rassoc == 0) no_space();

    ritem[0] = -1;
    ritem[1] = goal->index;
    ritem[2] = 0;
    ritem[3] = -2;
    rlhs[0] = 0;
    rlhs[1] = 0;
    rlhs[2] = start_symbol;
    rrhs[0] = 0;
    rrhs[1] = 0;
    rrhs[2] = 1;

    j = 4;
    for (i = 3; i < nrules; ++i) {
	if (plhs[i]->args > 0) {
	  if (plhs[i]->argnames) {
	    FREE(plhs[i]->argnames);
	    plhs[i]->argnames = 0;
	  }
	  if (plhs[i]->argtags) {
	    FREE(plhs[i]->argtags);
	    plhs[i]->argtags = 0;
	  }
	}
	rlhs[i] = plhs[i]->index;
	rrhs[i] = j;
	assoc = TOKEN;
	prec = 0;
	while (pitem[j]) {
	    ritem[j] = pitem[j]->index;
	    if (pitem[j]->class == TERM) {
		prec = pitem[j]->prec;
		assoc = pitem[j]->assoc; }
	    ++j; }
	ritem[j] = -i;
	++j;
	if (rprec[i] == UNDEFINED) {
	    rprec[i] = prec;
	    rassoc[i] = assoc; } }
    rrhs[i] = j;
    FREE(plhs);
    FREE(pitem);
    clean_arg_cache();
}